

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall
notch::core::FixedRate::clone
          (FixedRate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  
  uVar1 = *(undefined4 *)(__fn + 0x10);
  pp_Var2 = (_func_int **)operator_new(0x38);
  *pp_Var2 = (_func_int *)&PTR_update_001a4bb0;
  pp_Var2[1] = *(_func_int **)(__fn + 8);
  *(undefined4 *)(pp_Var2 + 2) = uVar1;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  (this->super_ALearningPolicy)._vptr_ALearningPolicy = pp_Var2;
  return (int)this;
}

Assistant:

virtual std::unique_ptr<ALearningPolicy> clone() const {
        float lr = learningRate;
        float m = momentum;
        float wd = weightDecay;
        auto c = std::unique_ptr<ALearningPolicy>(new FixedRate(lr, m, wd));
        return c;
    }